

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandBuffer.cpp
# Opt level: O0

void __thiscall
myvk::CommandBuffer::CmdCopy
          (CommandBuffer *this,Ptr<BufferBase> *src,Ptr<ImageBase> *dst,
          vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *regions,
          VkImageLayout layout)

{
  VkCommandBuffer pVVar1;
  PFN_vkCmdCopyBufferToImage p_Var2;
  element_type *this_00;
  VkBuffer pVVar3;
  element_type *this_01;
  VkImage pVVar4;
  size_type sVar5;
  VkBufferImageCopy *pVVar6;
  vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *in_RCX;
  long in_RDI;
  VkImageLayout in_R8D;
  
  p_Var2 = vkCmdCopyBufferToImage;
  pVVar1 = *(VkCommandBuffer *)(in_RDI + 0x28);
  this_00 = std::__shared_ptr_access<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2acb64);
  pVVar3 = BufferBase::GetHandle(this_00);
  this_01 = std::__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2acb7b);
  pVVar4 = ImageBase::GetHandle(this_01);
  sVar5 = std::vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>::size(in_RCX);
  pVVar6 = std::vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>::data
                     ((vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *)0x2acba8);
  (*p_Var2)(pVVar1,pVVar3,pVVar4,in_R8D,(uint32_t)sVar5,pVVar6);
  return;
}

Assistant:

void CommandBuffer::CmdCopy(const Ptr<BufferBase> &src, const Ptr<ImageBase> &dst,
                            const std::vector<VkBufferImageCopy> &regions, VkImageLayout layout) const {
	vkCmdCopyBufferToImage(m_command_buffer, src->GetHandle(), dst->GetHandle(), layout, regions.size(),
	                       regions.data());
}